

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioSourceVoice_Discontinuity(FAudioSourceVoice *voice)

{
  FAudioBufferEntry *pFVar1;
  FAudioBufferEntry *pFVar2;
  
  FAudio_PlatformLockMutex((voice->field_19).src.bufferLock);
  pFVar1 = (voice->field_19).src.bufferList;
  if (pFVar1 != (FAudioBufferEntry *)0x0) {
    do {
      pFVar2 = pFVar1;
      pFVar1 = pFVar2->next;
    } while (pFVar2->next != (FAudioBufferEntry *)0x0);
    *(byte *)&(pFVar2->buffer).Flags = (byte)(pFVar2->buffer).Flags | 0x40;
  }
  FAudio_PlatformUnlockMutex((voice->field_19).src.bufferLock);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_Discontinuity(
	FAudioSourceVoice *voice
) {
	FAudioBufferEntry *buf;

	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)

	if (voice->src.bufferList != NULL)
	{
		for (buf = voice->src.bufferList; buf->next != NULL; buf = buf->next);
		buf->buffer.Flags |= FAUDIO_END_OF_STREAM;
	}

	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}